

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O0

void art_iterator_down(art_iterator_t *iterator,art_ref_t ref,uint8_t index_in_node)

{
  char *pcVar1;
  undefined1 in_DL;
  art_ref_t in_RSI;
  long in_RDI;
  art_indexed_child_t aVar2;
  art_indexed_child_t indexed_child;
  art_inner_node_t *node;
  art_node_t *node_00;
  undefined1 in_stack_ffffffffffffffd0 [16];
  art_t *in_stack_ffffffffffffffe0;
  char *pcVar3;
  
  node_00 = in_stack_ffffffffffffffd0._0_8_;
  *(art_ref_t *)(in_RDI + 0x20 + (ulong)*(byte *)(in_RDI + 0x19) * 0x10) = in_RSI;
  *(undefined1 *)(in_RDI + (ulong)*(byte *)(in_RDI + 0x19) * 0x10 + 0x28) = in_DL;
  *(char *)(in_RDI + 0x19) = *(char *)(in_RDI + 0x19) + '\x01';
  pcVar1 = (char *)art_deref(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd0._8_8_);
  pcVar3 = pcVar1;
  art_ref_typecode(in_RSI);
  aVar2 = art_node_child_at(node_00,(art_typecode_t)((ulong)pcVar1 >> 0x38),(int)pcVar1);
  *(art_ref_t *)(in_RDI + 0x20 + (ulong)*(byte *)(in_RDI + 0x19) * 0x10) = aVar2.child;
  *(char *)(in_RDI + 0x18) = *(char *)(in_RDI + 0x18) + *pcVar3 + '\x01';
  return;
}

Assistant:

static void art_iterator_down(art_iterator_t *iterator, art_ref_t ref,
                              uint8_t index_in_node) {
    iterator->frames[iterator->frame].ref = ref;
    iterator->frames[iterator->frame].index_in_node = index_in_node;
    iterator->frame++;
    art_inner_node_t *node = (art_inner_node_t *)art_deref(iterator->art, ref);
    art_indexed_child_t indexed_child = art_node_child_at(
        (art_node_t *)node, art_ref_typecode(ref), index_in_node);
    assert(indexed_child.child != CROARING_ART_NULL_REF);
    iterator->frames[iterator->frame].ref = indexed_child.child;
    iterator->depth += node->prefix_size + 1;
}